

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetItemUsingMouseWheel(void)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  IVar1 = (GImGui->LastItemData).ID;
  if (GImGui->HoveredId == IVar1) {
    GImGui->HoveredIdUsingMouseWheel = true;
  }
  if (pIVar2->ActiveId == IVar1) {
    pIVar2->ActiveIdUsingMouseWheel = true;
  }
  return;
}

Assistant:

void ImGui::SetItemUsingMouseWheel()
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = g.LastItemData.ID;
    if (g.HoveredId == id)
        g.HoveredIdUsingMouseWheel = true;
    if (g.ActiveId == id)
        g.ActiveIdUsingMouseWheel = true;
}